

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

JCOEF largest_common_denominator(JCOEF a,JCOEF b)

{
  short sVar1;
  JCOEF c;
  JCOEF b_local;
  JCOEF a_local;
  
  sVar1 = b;
  a_local = a;
  do {
    b_local = sVar1;
    sVar1 = a_local % b_local;
    a_local = b_local;
  } while (sVar1 != 0);
  return b_local;
}

Assistant:

LOCAL(JCOEF)
largest_common_denominator(JCOEF a, JCOEF b)
{
  JCOEF c;

  do {
    c = a % b;
    a = b;
    b = c;
  } while (c);

  return a;
}